

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadInt32(ON_BinaryArchive *this,size_t count,ON__INT32 *p)

{
  size_t count_00;
  ushort *puVar1;
  ON__INT32 OVar2;
  size_t sVar3;
  size_t sVar4;
  
  count_00 = count * 4;
  sVar3 = Read(this,count_00,p);
  if ((count != 0 && sVar3 == count_00) && this->m_endian == big_endian) {
    sVar4 = 0;
    do {
      OVar2 = p[sVar4];
      *(undefined1 *)(p + sVar4) = *(undefined1 *)((long)p + sVar4 * 4 + 3);
      *(char *)((long)p + sVar4 * 4 + 3) = (char)OVar2;
      puVar1 = (ushort *)((long)p + sVar4 * 4 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      sVar4 = sVar4 + 1;
    } while (count != sVar4);
  }
  return sVar3 == count_00;
}

Assistant:

bool
ON_BinaryArchive::ReadInt32( // Read an array of 32 bit signed integers
		size_t count,            // number of 32 bit signed integers to read
		ON__INT32* p
		)
{
  bool rc = ReadByte( count<<2, p );
  if (rc && m_endian == ON::endian::big_endian)
  {
		unsigned char* b= (unsigned char*)p;
		unsigned char  c;
		while(count--) {
			c = b[0]; b[0] = b[3]; b[3] = c;
			c = b[1]; b[1] = b[2]; b[2] = c;
			b += 4;
		}
  }
  return rc;
}